

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_SUN_global_alpha(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_SUN_global_alpha != 0) {
    glad_glGlobalAlphaFactorbSUN =
         (PFNGLGLOBALALPHAFACTORBSUNPROC)(*load)("glGlobalAlphaFactorbSUN");
    glad_glGlobalAlphaFactorsSUN =
         (PFNGLGLOBALALPHAFACTORSSUNPROC)(*load)("glGlobalAlphaFactorsSUN");
    glad_glGlobalAlphaFactoriSUN =
         (PFNGLGLOBALALPHAFACTORISUNPROC)(*load)("glGlobalAlphaFactoriSUN");
    glad_glGlobalAlphaFactorfSUN =
         (PFNGLGLOBALALPHAFACTORFSUNPROC)(*load)("glGlobalAlphaFactorfSUN");
    glad_glGlobalAlphaFactordSUN =
         (PFNGLGLOBALALPHAFACTORDSUNPROC)(*load)("glGlobalAlphaFactordSUN");
    glad_glGlobalAlphaFactorubSUN =
         (PFNGLGLOBALALPHAFACTORUBSUNPROC)(*load)("glGlobalAlphaFactorubSUN");
    glad_glGlobalAlphaFactorusSUN =
         (PFNGLGLOBALALPHAFACTORUSSUNPROC)(*load)("glGlobalAlphaFactorusSUN");
    glad_glGlobalAlphaFactoruiSUN =
         (PFNGLGLOBALALPHAFACTORUISUNPROC)(*load)("glGlobalAlphaFactoruiSUN");
  }
  return;
}

Assistant:

static void load_GL_SUN_global_alpha(GLADloadproc load) {
	if(!GLAD_GL_SUN_global_alpha) return;
	glad_glGlobalAlphaFactorbSUN = (PFNGLGLOBALALPHAFACTORBSUNPROC)load("glGlobalAlphaFactorbSUN");
	glad_glGlobalAlphaFactorsSUN = (PFNGLGLOBALALPHAFACTORSSUNPROC)load("glGlobalAlphaFactorsSUN");
	glad_glGlobalAlphaFactoriSUN = (PFNGLGLOBALALPHAFACTORISUNPROC)load("glGlobalAlphaFactoriSUN");
	glad_glGlobalAlphaFactorfSUN = (PFNGLGLOBALALPHAFACTORFSUNPROC)load("glGlobalAlphaFactorfSUN");
	glad_glGlobalAlphaFactordSUN = (PFNGLGLOBALALPHAFACTORDSUNPROC)load("glGlobalAlphaFactordSUN");
	glad_glGlobalAlphaFactorubSUN = (PFNGLGLOBALALPHAFACTORUBSUNPROC)load("glGlobalAlphaFactorubSUN");
	glad_glGlobalAlphaFactorusSUN = (PFNGLGLOBALALPHAFACTORUSSUNPROC)load("glGlobalAlphaFactorusSUN");
	glad_glGlobalAlphaFactoruiSUN = (PFNGLGLOBALALPHAFACTORUISUNPROC)load("glGlobalAlphaFactoruiSUN");
}